

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexHashMap.h
# Opt level: O0

FaceData * __thiscall
Ptex::v2_2::PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>::
tryInsert(PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>
          *this,ReductionKey *key,FaceData *value,size_t *newMemUsed)

{
  uint32_t uVar1;
  bool bVar2;
  uint32_t uVar3;
  Entry *entries_00;
  FaceData *in_RDX;
  EVP_PKEY_CTX *in_RSI;
  PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*> *in_RDI;
  Entry *e;
  uint32_t i;
  FaceData *result;
  uint32_t hash;
  uint32_t mask;
  Entry *entries;
  size_t *in_stack_ffffffffffffffb8;
  Entry *this_00;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  FaceData *local_38;
  
  entries_00 = lockEntriesAndGrowIfNeeded
                         ((PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>
                           *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                          in_stack_ffffffffffffffb8);
  uVar1 = in_RDI->_numEntries;
  uVar3 = PtexReader::ReductionKey::hash((ReductionKey *)in_RSI);
  do {
    this_00 = entries_00 + (uVar3 & uVar1 - 1);
    if (this_00->value == (FaceData *)0x0) {
      this_00->value = in_RDX;
      in_RDI->_size = in_RDI->_size + 1;
      PtexReader::ReductionKey::copy(&this_00->key,in_RSI,(EVP_PKEY_CTX *)in_RDX);
      local_38 = this_00->value;
LAB_0013caa4:
      unlockEntries(in_RDI,entries_00);
      return local_38;
    }
    do {
      bVar2 = PtexReader::ReductionKey::isEmpty(&this_00->key);
    } while (bVar2);
    bVar2 = PtexReader::ReductionKey::matches(&this_00->key,(ReductionKey *)in_RSI);
    if (bVar2) {
      local_38 = this_00->value;
      goto LAB_0013caa4;
    }
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

Value tryInsert(Key& key, Value value, size_t& newMemUsed)
    {
        Entry* entries = lockEntriesAndGrowIfNeeded(newMemUsed);
        uint32_t mask = _numEntries-1;
        uint32_t hash = key.hash();

        Value result = 0;
        for (uint32_t i = hash;; ++i) {
            Entry& e = entries[i & mask];
            if (e.value == 0) {
                e.value = value;
                ++_size;
                PtexMemoryFence();
                e.key.copy(key);
                result = e.value;
                break;
            }
            while (e.key.isEmpty()) ;
            if (e.key.matches(key)) {
                result = e.value;
                break;
            }
        }
        unlockEntries(entries);
        return result;
    }